

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_8,_257,_true,_embree::avx::VirtualCurveIntersectorK<8>,_true>::
     intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
               RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  StackItemT<embree::NodeRefPtr<4>_> SVar11;
  StackItemT<embree::NodeRefPtr<4>_> SVar12;
  StackItemT<embree::NodeRefPtr<4>_> SVar13;
  bool bVar14;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar15;
  int iVar16;
  undefined4 uVar17;
  ulong unaff_RBX;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  size_t sVar21;
  ulong uVar22;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar23;
  ulong uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  vint4 ai;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  vint4 ai_3;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  vint4 ai_1;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  vint4 bi_1;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  vint4 bi_3;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  vint4 bi;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar53;
  float fVar55;
  float fVar56;
  undefined1 auVar54 [16];
  float fVar57;
  float fVar58;
  float fVar61;
  float fVar62;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar63;
  float fVar64;
  float fVar67;
  float fVar68;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar23 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar1 = *(float *)((long)&(tray->org).field_0 + k * 4);
  auVar72._4_4_ = fVar1;
  auVar72._0_4_ = fVar1;
  auVar72._8_4_ = fVar1;
  auVar72._12_4_ = fVar1;
  fVar2 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar73._4_4_ = fVar2;
  auVar73._0_4_ = fVar2;
  auVar73._8_4_ = fVar2;
  auVar73._12_4_ = fVar2;
  fVar3 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  auVar70._4_4_ = fVar3;
  auVar70._0_4_ = fVar3;
  auVar70._8_4_ = fVar3;
  auVar70._12_4_ = fVar3;
  fVar4 = *(float *)((long)&(tray->dir).field_0 + k * 4);
  fVar5 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar6 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x40);
  fVar53 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar55 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar56 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar44 = ZEXT416((uint)(fVar53 * 0.99999964));
  auVar44 = vshufps_avx(auVar44,auVar44,0);
  auVar45 = ZEXT416((uint)(fVar55 * 0.99999964));
  auVar45 = vshufps_avx(auVar45,auVar45,0);
  auVar40 = ZEXT416((uint)(fVar56 * 0.99999964));
  auVar40 = vshufps_avx(auVar40,auVar40,0);
  auVar25 = ZEXT416((uint)(fVar53 * 1.0000004));
  auVar25 = vshufps_avx(auVar25,auVar25,0);
  auVar26 = ZEXT416((uint)(fVar55 * 1.0000004));
  auVar26 = vshufps_avx(auVar26,auVar26,0);
  auVar27 = ZEXT416((uint)(fVar56 * 1.0000004));
  auVar27 = vshufps_avx(auVar27,auVar27,0);
  uVar18 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar19 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar16 = (tray->tnear).field_0.i[k];
  auVar51._4_4_ = iVar16;
  auVar51._0_4_ = iVar16;
  auVar51._8_4_ = iVar16;
  auVar51._12_4_ = iVar16;
  iVar16 = (tray->tfar).field_0.i[k];
  auVar28 = ZEXT1664(CONCAT412(iVar16,CONCAT48(iVar16,CONCAT44(iVar16,iVar16))));
  do {
    do {
      if (pSVar23 == stack) {
        return;
      }
      pSVar15 = pSVar23 + -1;
      pSVar23 = pSVar23 + -1;
    } while (*(float *)(ray + k * 4 + 0x100) < (float)pSVar15->dist);
    sVar21 = (pSVar23->ptr).ptr;
    do {
      if ((sVar21 & 0xf) == 0) {
        auVar33 = vsubps_avx(*(undefined1 (*) [16])(sVar21 + 0x20 + uVar18),auVar72);
        auVar29._0_4_ = auVar44._0_4_ * auVar33._0_4_;
        auVar29._4_4_ = auVar44._4_4_ * auVar33._4_4_;
        auVar29._8_4_ = auVar44._8_4_ * auVar33._8_4_;
        auVar29._12_4_ = auVar44._12_4_ * auVar33._12_4_;
        auVar33 = vsubps_avx(*(undefined1 (*) [16])(sVar21 + 0x20 + uVar19),auVar73);
        auVar35._0_4_ = auVar45._0_4_ * auVar33._0_4_;
        auVar35._4_4_ = auVar45._4_4_ * auVar33._4_4_;
        auVar35._8_4_ = auVar45._8_4_ * auVar33._8_4_;
        auVar35._12_4_ = auVar45._12_4_ * auVar33._12_4_;
        auVar33 = vmaxps_avx(auVar29,auVar35);
        auVar59 = vsubps_avx(*(undefined1 (*) [16])(sVar21 + 0x20 + uVar24),auVar70);
        auVar36._0_4_ = auVar40._0_4_ * auVar59._0_4_;
        auVar36._4_4_ = auVar40._4_4_ * auVar59._4_4_;
        auVar36._8_4_ = auVar40._8_4_ * auVar59._8_4_;
        auVar36._12_4_ = auVar40._12_4_ * auVar59._12_4_;
        auVar59 = vsubps_avx(*(undefined1 (*) [16])(sVar21 + 0x20 + (uVar18 ^ 0x10)),auVar72);
        auVar41._0_4_ = auVar25._0_4_ * auVar59._0_4_;
        auVar41._4_4_ = auVar25._4_4_ * auVar59._4_4_;
        auVar41._8_4_ = auVar25._8_4_ * auVar59._8_4_;
        auVar41._12_4_ = auVar25._12_4_ * auVar59._12_4_;
        auVar59 = vsubps_avx(*(undefined1 (*) [16])(sVar21 + 0x20 + (uVar19 ^ 0x10)),auVar73);
        auVar46._0_4_ = auVar26._0_4_ * auVar59._0_4_;
        auVar46._4_4_ = auVar26._4_4_ * auVar59._4_4_;
        auVar46._8_4_ = auVar26._8_4_ * auVar59._8_4_;
        auVar46._12_4_ = auVar26._12_4_ * auVar59._12_4_;
        auVar32 = vminps_avx(auVar41,auVar46);
        auVar59 = vsubps_avx(*(undefined1 (*) [16])(sVar21 + 0x20 + (uVar24 ^ 0x10)),auVar70);
        auVar47._0_4_ = auVar27._0_4_ * auVar59._0_4_;
        auVar47._4_4_ = auVar27._4_4_ * auVar59._4_4_;
        auVar47._8_4_ = auVar27._8_4_ * auVar59._8_4_;
        auVar47._12_4_ = auVar27._12_4_ * auVar59._12_4_;
        auVar59 = vmaxps_avx(auVar36,auVar51);
        tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vmaxps_avx(auVar33,auVar59);
        auVar33 = vminps_avx(auVar47,auVar28._0_16_);
        auVar33 = vminps_avx(auVar32,auVar33);
        auVar33 = vcmpps_avx((undefined1  [16])tNear.field_0,auVar33,2);
        uVar17 = vmovmskps_avx(auVar33);
LAB_003f0596:
        unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar17);
        bVar14 = true;
      }
      else {
        if ((int)(sVar21 & 0xf) == 2) {
          uVar20 = sVar21 & 0xfffffffffffffff0;
          auVar59._0_4_ =
               *(float *)(uVar20 + 0x50) * fVar5 + fVar6 * *(float *)(uVar20 + 0x80) +
               fVar4 * *(float *)(uVar20 + 0x20);
          auVar59._4_4_ =
               *(float *)(uVar20 + 0x54) * fVar5 + fVar6 * *(float *)(uVar20 + 0x84) +
               fVar4 * *(float *)(uVar20 + 0x24);
          auVar59._8_4_ =
               *(float *)(uVar20 + 0x58) * fVar5 + fVar6 * *(float *)(uVar20 + 0x88) +
               fVar4 * *(float *)(uVar20 + 0x28);
          auVar59._12_4_ =
               *(float *)(uVar20 + 0x5c) * fVar5 + fVar6 * *(float *)(uVar20 + 0x8c) +
               fVar4 * *(float *)(uVar20 + 0x2c);
          auVar65._0_4_ =
               fVar6 * *(float *)(uVar20 + 0x90) + fVar5 * *(float *)(uVar20 + 0x60) +
               fVar4 * *(float *)(uVar20 + 0x30);
          auVar65._4_4_ =
               fVar6 * *(float *)(uVar20 + 0x94) + fVar5 * *(float *)(uVar20 + 100) +
               fVar4 * *(float *)(uVar20 + 0x34);
          auVar65._8_4_ =
               fVar6 * *(float *)(uVar20 + 0x98) + fVar5 * *(float *)(uVar20 + 0x68) +
               fVar4 * *(float *)(uVar20 + 0x38);
          auVar65._12_4_ =
               fVar6 * *(float *)(uVar20 + 0x9c) + fVar5 * *(float *)(uVar20 + 0x6c) +
               fVar4 * *(float *)(uVar20 + 0x3c);
          auVar54._0_4_ =
               fVar6 * *(float *)(uVar20 + 0xa0) + *(float *)(uVar20 + 0x70) * fVar5 +
               fVar4 * *(float *)(uVar20 + 0x40);
          auVar54._4_4_ =
               fVar6 * *(float *)(uVar20 + 0xa4) + *(float *)(uVar20 + 0x74) * fVar5 +
               fVar4 * *(float *)(uVar20 + 0x44);
          auVar54._8_4_ =
               fVar6 * *(float *)(uVar20 + 0xa8) + *(float *)(uVar20 + 0x78) * fVar5 +
               fVar4 * *(float *)(uVar20 + 0x48);
          auVar54._12_4_ =
               fVar6 * *(float *)(uVar20 + 0xac) + *(float *)(uVar20 + 0x7c) * fVar5 +
               fVar4 * *(float *)(uVar20 + 0x4c);
          auVar30._8_4_ = 0x7fffffff;
          auVar30._0_8_ = 0x7fffffff7fffffff;
          auVar30._12_4_ = 0x7fffffff;
          auVar33 = vandps_avx(auVar59,auVar30);
          auVar37._8_4_ = 0x219392ef;
          auVar37._0_8_ = 0x219392ef219392ef;
          auVar37._12_4_ = 0x219392ef;
          auVar33 = vcmpps_avx(auVar33,auVar37,1);
          auVar59 = vblendvps_avx(auVar59,auVar37,auVar33);
          auVar33 = vandps_avx(auVar65,auVar30);
          auVar33 = vcmpps_avx(auVar33,auVar37,1);
          auVar32 = vblendvps_avx(auVar65,auVar37,auVar33);
          auVar33 = vandps_avx(auVar54,auVar30);
          auVar33 = vcmpps_avx(auVar33,auVar37,1);
          auVar33 = vblendvps_avx(auVar54,auVar37,auVar33);
          auVar30 = vrcpps_avx(auVar59);
          fVar53 = auVar30._0_4_;
          auVar60._0_4_ = fVar53 * auVar59._0_4_;
          fVar55 = auVar30._4_4_;
          auVar60._4_4_ = fVar55 * auVar59._4_4_;
          fVar56 = auVar30._8_4_;
          auVar60._8_4_ = fVar56 * auVar59._8_4_;
          fVar57 = auVar30._12_4_;
          auVar60._12_4_ = fVar57 * auVar59._12_4_;
          auVar31._8_4_ = 0x3f800000;
          auVar31._0_8_ = &DAT_3f8000003f800000;
          auVar31._12_4_ = 0x3f800000;
          auVar59 = vsubps_avx(auVar31,auVar60);
          fVar53 = fVar53 + fVar53 * auVar59._0_4_;
          fVar55 = fVar55 + fVar55 * auVar59._4_4_;
          fVar56 = fVar56 + fVar56 * auVar59._8_4_;
          fVar57 = fVar57 + fVar57 * auVar59._12_4_;
          auVar59 = vrcpps_avx(auVar32);
          fVar58 = auVar59._0_4_;
          auVar66._0_4_ = fVar58 * auVar32._0_4_;
          fVar61 = auVar59._4_4_;
          auVar66._4_4_ = fVar61 * auVar32._4_4_;
          fVar62 = auVar59._8_4_;
          auVar66._8_4_ = fVar62 * auVar32._8_4_;
          fVar63 = auVar59._12_4_;
          auVar66._12_4_ = fVar63 * auVar32._12_4_;
          auVar59 = vsubps_avx(auVar31,auVar66);
          fVar58 = fVar58 + fVar58 * auVar59._0_4_;
          fVar61 = fVar61 + fVar61 * auVar59._4_4_;
          fVar62 = fVar62 + fVar62 * auVar59._8_4_;
          fVar63 = fVar63 + fVar63 * auVar59._12_4_;
          auVar59 = vrcpps_avx(auVar33);
          fVar64 = auVar59._0_4_;
          auVar71._0_4_ = fVar64 * auVar33._0_4_;
          fVar67 = auVar59._4_4_;
          auVar71._4_4_ = fVar67 * auVar33._4_4_;
          fVar68 = auVar59._8_4_;
          auVar71._8_4_ = fVar68 * auVar33._8_4_;
          fVar69 = auVar59._12_4_;
          auVar71._12_4_ = fVar69 * auVar33._12_4_;
          auVar33 = vsubps_avx(auVar31,auVar71);
          fVar64 = fVar64 + fVar64 * auVar33._0_4_;
          fVar67 = fVar67 + fVar67 * auVar33._4_4_;
          fVar68 = fVar68 + fVar68 * auVar33._8_4_;
          fVar69 = fVar69 + fVar69 * auVar33._12_4_;
          auVar42._0_4_ =
               (fVar1 * *(float *)(uVar20 + 0x20) +
               fVar2 * *(float *)(uVar20 + 0x50) +
               fVar3 * *(float *)(uVar20 + 0x80) + *(float *)(uVar20 + 0xb0)) * -fVar53;
          auVar42._4_4_ =
               (fVar1 * *(float *)(uVar20 + 0x24) +
               fVar2 * *(float *)(uVar20 + 0x54) +
               fVar3 * *(float *)(uVar20 + 0x84) + *(float *)(uVar20 + 0xb4)) * -fVar55;
          auVar42._8_4_ =
               (fVar1 * *(float *)(uVar20 + 0x28) +
               fVar2 * *(float *)(uVar20 + 0x58) +
               fVar3 * *(float *)(uVar20 + 0x88) + *(float *)(uVar20 + 0xb8)) * -fVar56;
          auVar42._12_4_ =
               (fVar1 * *(float *)(uVar20 + 0x2c) +
               fVar2 * *(float *)(uVar20 + 0x5c) +
               fVar3 * *(float *)(uVar20 + 0x8c) + *(float *)(uVar20 + 0xbc)) * -fVar57;
          auVar38._0_4_ =
               (fVar1 * *(float *)(uVar20 + 0x30) +
               fVar2 * *(float *)(uVar20 + 0x60) +
               fVar3 * *(float *)(uVar20 + 0x90) + *(float *)(uVar20 + 0xc0)) * -fVar58;
          auVar38._4_4_ =
               (fVar1 * *(float *)(uVar20 + 0x34) +
               fVar2 * *(float *)(uVar20 + 100) +
               fVar3 * *(float *)(uVar20 + 0x94) + *(float *)(uVar20 + 0xc4)) * -fVar61;
          auVar38._8_4_ =
               (fVar1 * *(float *)(uVar20 + 0x38) +
               fVar2 * *(float *)(uVar20 + 0x68) +
               fVar3 * *(float *)(uVar20 + 0x98) + *(float *)(uVar20 + 200)) * -fVar62;
          auVar38._12_4_ =
               (fVar1 * *(float *)(uVar20 + 0x3c) +
               fVar2 * *(float *)(uVar20 + 0x6c) +
               fVar3 * *(float *)(uVar20 + 0x9c) + *(float *)(uVar20 + 0xcc)) * -fVar63;
          auVar32._0_4_ =
               (fVar1 * *(float *)(uVar20 + 0x40) +
               fVar2 * *(float *)(uVar20 + 0x70) +
               fVar3 * *(float *)(uVar20 + 0xa0) + *(float *)(uVar20 + 0xd0)) * -fVar64;
          auVar32._4_4_ =
               (fVar1 * *(float *)(uVar20 + 0x44) +
               fVar2 * *(float *)(uVar20 + 0x74) +
               fVar3 * *(float *)(uVar20 + 0xa4) + *(float *)(uVar20 + 0xd4)) * -fVar67;
          auVar32._8_4_ =
               (fVar1 * *(float *)(uVar20 + 0x48) +
               fVar2 * *(float *)(uVar20 + 0x78) +
               fVar3 * *(float *)(uVar20 + 0xa8) + *(float *)(uVar20 + 0xd8)) * -fVar68;
          auVar32._12_4_ =
               (fVar1 * *(float *)(uVar20 + 0x4c) +
               fVar2 * *(float *)(uVar20 + 0x7c) +
               fVar3 * *(float *)(uVar20 + 0xac) + *(float *)(uVar20 + 0xdc)) * -fVar69;
          auVar48._0_4_ = fVar53 + auVar42._0_4_;
          auVar48._4_4_ = fVar55 + auVar42._4_4_;
          auVar48._8_4_ = fVar56 + auVar42._8_4_;
          auVar48._12_4_ = fVar57 + auVar42._12_4_;
          auVar49._0_4_ = fVar58 + auVar38._0_4_;
          auVar49._4_4_ = fVar61 + auVar38._4_4_;
          auVar49._8_4_ = fVar62 + auVar38._8_4_;
          auVar49._12_4_ = fVar63 + auVar38._12_4_;
          auVar52._0_4_ = fVar64 + auVar32._0_4_;
          auVar52._4_4_ = fVar67 + auVar32._4_4_;
          auVar52._8_4_ = fVar68 + auVar32._8_4_;
          auVar52._12_4_ = fVar69 + auVar32._12_4_;
          auVar33 = vpminsd_avx(auVar38,auVar49);
          auVar59 = vpminsd_avx(auVar32,auVar52);
          auVar33 = vmaxps_avx(auVar33,auVar59);
          auVar31 = vpminsd_avx(auVar42,auVar48);
          auVar30 = vpmaxsd_avx(auVar42,auVar48);
          auVar59 = vpmaxsd_avx(auVar38,auVar49);
          auVar32 = vpmaxsd_avx(auVar32,auVar52);
          auVar32 = vminps_avx(auVar59,auVar32);
          auVar59 = vmaxps_avx(auVar51,auVar31);
          auVar33 = vmaxps_avx(auVar59,auVar33);
          auVar59 = vminps_avx(auVar28._0_16_,auVar30);
          auVar59 = vminps_avx(auVar59,auVar32);
          tNear.field_0._0_4_ = auVar33._0_4_ * 0.99999964;
          tNear.field_0._4_4_ = auVar33._4_4_ * 0.99999964;
          tNear.field_0._8_4_ = auVar33._8_4_ * 0.99999964;
          tNear.field_0._12_4_ = auVar33._12_4_ * 0.99999964;
          auVar33._0_4_ = auVar59._0_4_ * 1.0000004;
          auVar33._4_4_ = auVar59._4_4_ * 1.0000004;
          auVar33._8_4_ = auVar59._8_4_ * 1.0000004;
          auVar33._12_4_ = auVar59._12_4_ * 1.0000004;
          auVar33 = vcmpps_avx((undefined1  [16])tNear.field_0,auVar33,2);
          uVar17 = vmovmskps_avx(auVar33);
          goto LAB_003f0596;
        }
        bVar14 = false;
      }
      if (bVar14) {
        if (unaff_RBX == 0) {
          iVar16 = 4;
        }
        else {
          uVar20 = sVar21 & 0xfffffffffffffff0;
          lVar10 = 0;
          if (unaff_RBX != 0) {
            for (; (unaff_RBX >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
            }
          }
          iVar16 = 0;
          sVar21 = *(ulong *)(uVar20 + lVar10 * 8);
          uVar22 = unaff_RBX - 1 & unaff_RBX;
          if (uVar22 != 0) {
            uVar7 = tNear.field_0.i[lVar10];
            lVar10 = 0;
            if (uVar22 != 0) {
              for (; (uVar22 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
              }
            }
            uVar9 = *(ulong *)(uVar20 + lVar10 * 8);
            uVar8 = tNear.field_0.i[lVar10];
            uVar22 = uVar22 - 1 & uVar22;
            if (uVar22 == 0) {
              if (uVar7 < uVar8) {
                (pSVar23->ptr).ptr = uVar9;
                pSVar23->dist = uVar8;
                pSVar23 = pSVar23 + 1;
              }
              else {
                (pSVar23->ptr).ptr = sVar21;
                pSVar23->dist = uVar7;
                sVar21 = uVar9;
                pSVar23 = pSVar23 + 1;
              }
            }
            else {
              auVar34._8_8_ = 0;
              auVar34._0_8_ = sVar21;
              auVar33 = vpunpcklqdq_avx(auVar34,ZEXT416(uVar7));
              auVar39._8_8_ = 0;
              auVar39._0_8_ = uVar9;
              auVar59 = vpunpcklqdq_avx(auVar39,ZEXT416(uVar8));
              lVar10 = 0;
              if (uVar22 != 0) {
                for (; (uVar22 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
                }
              }
              auVar43._8_8_ = 0;
              auVar43._0_8_ = *(ulong *)(uVar20 + lVar10 * 8);
              auVar30 = vpunpcklqdq_avx(auVar43,ZEXT416((uint)tNear.field_0.i[lVar10]));
              auVar32 = vpcmpgtd_avx(auVar59,auVar33);
              uVar22 = uVar22 - 1 & uVar22;
              if (uVar22 == 0) {
                auVar31 = vpshufd_avx(auVar32,0xaa);
                auVar32 = vblendvps_avx(auVar59,auVar33,auVar31);
                auVar33 = vblendvps_avx(auVar33,auVar59,auVar31);
                auVar59 = vpcmpgtd_avx(auVar30,auVar32);
                auVar31 = vpshufd_avx(auVar59,0xaa);
                auVar59 = vblendvps_avx(auVar30,auVar32,auVar31);
                auVar32 = vblendvps_avx(auVar32,auVar30,auVar31);
                auVar30 = vpcmpgtd_avx(auVar32,auVar33);
                auVar30 = vpshufd_avx(auVar30,0xaa);
                SVar11 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar32,auVar33,auVar30);
                SVar12 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar33,auVar32,auVar30);
                *pSVar23 = SVar12;
                pSVar23[1] = SVar11;
                sVar21 = auVar59._0_8_;
                pSVar23 = pSVar23 + 2;
              }
              else {
                lVar10 = 0;
                if (uVar22 != 0) {
                  for (; (uVar22 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
                  }
                }
                auVar50._8_8_ = 0;
                auVar50._0_8_ = *(ulong *)(uVar20 + lVar10 * 8);
                auVar37 = vpunpcklqdq_avx(auVar50,ZEXT416((uint)tNear.field_0.i[lVar10]));
                auVar31 = vpshufd_avx(auVar32,0xaa);
                auVar32 = vblendvps_avx(auVar59,auVar33,auVar31);
                auVar33 = vblendvps_avx(auVar33,auVar59,auVar31);
                auVar59 = vpcmpgtd_avx(auVar37,auVar30);
                auVar31 = vpshufd_avx(auVar59,0xaa);
                auVar59 = vblendvps_avx(auVar37,auVar30,auVar31);
                auVar30 = vblendvps_avx(auVar30,auVar37,auVar31);
                auVar31 = vpcmpgtd_avx(auVar30,auVar33);
                auVar37 = vpshufd_avx(auVar31,0xaa);
                auVar31 = vblendvps_avx(auVar30,auVar33,auVar37);
                SVar11 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar33,auVar30,auVar37);
                auVar33 = vpcmpgtd_avx(auVar59,auVar32);
                auVar30 = vpshufd_avx(auVar33,0xaa);
                auVar33 = vblendvps_avx(auVar59,auVar32,auVar30);
                auVar59 = vblendvps_avx(auVar32,auVar59,auVar30);
                auVar32 = vpcmpgtd_avx(auVar31,auVar59);
                auVar32 = vpshufd_avx(auVar32,0xaa);
                SVar12 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar31,auVar59,auVar32);
                SVar13 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar59,auVar31,auVar32);
                *pSVar23 = SVar11;
                pSVar23[1] = SVar13;
                pSVar23[2] = SVar12;
                sVar21 = auVar33._0_8_;
                pSVar23 = pSVar23 + 3;
              }
            }
          }
        }
      }
      else {
        iVar16 = 6;
      }
    } while (iVar16 == 0);
    if (iVar16 == 6) {
      (**(code **)((long)This->leafIntersector +
                  (ulong)*(byte *)(sVar21 & 0xfffffffffffffff0) * 0x40 + 0x20))(pre,ray,k,context);
      uVar17 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar28 = ZEXT1664(CONCAT412(uVar17,CONCAT48(uVar17,CONCAT44(uVar17,uVar17))));
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }